

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O0

void __thiscall ErrorCommand::~ErrorCommand(ErrorCommand *this)

{
  ErrorCommand *this_local;
  
  ~ErrorCommand(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~ErrorCommand() = default;